

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_directory.hpp
# Opt level: O0

void vfs::posix_directory::scan<vfs::directory_interface<vfs::posix_directory>>
               (path *dirPath,
               vector<vfs::directory_interface<vfs::posix_directory>,_std::allocator<vfs::directory_interface<vfs::posix_directory>_>_>
               *subDirectories,vector<vfs::path,_std::allocator<vfs::path>_> *files)

{
  int iVar1;
  char *__name;
  size_t sVar2;
  char (*in_RCX) [256];
  size_t nameLen;
  path local_58;
  path *local_38;
  path *currentFilePath;
  dirent *pEntry;
  DIR *pDir;
  vector<vfs::path,_std::allocator<vfs::path>_> *files_local;
  vector<vfs::directory_interface<vfs::posix_directory>,_std::allocator<vfs::directory_interface<vfs::posix_directory>_>_>
  *subDirectories_local;
  path *dirPath_local;
  
  pDir = (DIR *)files;
  files_local = (vector<vfs::path,_std::allocator<vfs::path>_> *)subDirectories;
  subDirectories_local =
       (vector<vfs::directory_interface<vfs::posix_directory>,_std::allocator<vfs::directory_interface<vfs::posix_directory>_>_>
        *)dirPath;
  __name = path::c_str(dirPath);
  pEntry = (dirent *)opendir(__name);
  if (pEntry != (dirent *)0x0) {
    currentFilePath = (path *)0x0;
    while (currentFilePath = (path *)readdir((DIR *)pEntry),
          (dirent *)currentFilePath != (dirent *)0x0) {
      path::combine<char(&)[256]>
                (&local_58,(path *)subDirectories_local,(path *)((dirent *)currentFilePath)->d_name,
                 in_RCX);
      local_38 = &local_58;
      if ((currentFilePath->pathStr_).field_2._M_local_buf[2] == '\b') {
        std::vector<vfs::path,std::allocator<vfs::path>>::emplace_back<vfs::path_const>
                  ((vector<vfs::path,std::allocator<vfs::path>> *)pDir,local_38);
      }
      else if ((((currentFilePath->pathStr_).field_2._M_local_buf[2] == '\x04') &&
               ((sVar2 = strlen((currentFilePath->pathStr_).field_2._M_local_buf + 3), sVar2 != 1 ||
                ((currentFilePath->pathStr_).field_2._M_local_buf[3] != '.')))) &&
              ((sVar2 != 2 ||
               (iVar1 = strncmp((currentFilePath->pathStr_).field_2._M_local_buf + 3,"..",2),
               iVar1 != 0)))) {
        std::
        vector<vfs::directory_interface<vfs::posix_directory>,std::allocator<vfs::directory_interface<vfs::posix_directory>>>
        ::emplace_back<vfs::path_const>
                  ((vector<vfs::directory_interface<vfs::posix_directory>,std::allocator<vfs::directory_interface<vfs::posix_directory>>>
                    *)files_local,local_38);
      }
      path::~path(&local_58);
    }
    closedir((DIR *)pEntry);
  }
  return;
}

Assistant:

static void scan(const path &dirPath, std::vector<_Dir> &subDirectories, std::vector<path> &files)
        {
            DIR *pDir = opendir(dirPath.c_str());
            if (pDir == nullptr)
            {
                return;
            }

            struct dirent *pEntry = nullptr;
            while ((pEntry = readdir(pDir)) != nullptr)
            {
                const auto &currentFilePath = path::combine(dirPath, pEntry->d_name);

                if (pEntry->d_type == DT_REG)
                {
                    files.emplace_back(std::move(currentFilePath));
                }
                else if (pEntry->d_type == DT_DIR)
                {
                    const auto nameLen = strlen(pEntry->d_name);
                    if (!((nameLen == 1 && pEntry->d_name[0] == '.') ||
                          (nameLen == 2 && strncmp(pEntry->d_name, "..", 2) == 0)))
                    {
                        subDirectories.emplace_back(std::move(currentFilePath));
                    }
                }
            }

            closedir(pDir);
        }